

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O0

void __thiscall
Minisat::OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::clean
          (OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *this,
          Lit *idx)

{
  bool bVar1;
  int iVar2;
  vec<Minisat::Watcher> *this_00;
  Watcher *pWVar3;
  Watcher *pWVar4;
  char *pcVar5;
  int *in_RSI;
  vec<Minisat::vec<Minisat::Watcher>_> *in_RDI;
  int j;
  int i;
  vec<Minisat::Watcher> *vec;
  Watcher *in_stack_ffffffffffffffa8;
  WatcherDeleted *in_stack_ffffffffffffffb0;
  vec<Minisat::vec<Minisat::Watcher>_> *this_01;
  int local_24;
  int local_20;
  
  iVar2 = toInt((Lit)*in_RSI);
  this_00 = vec<Minisat::vec<Minisat::Watcher>_>::operator[](in_RDI,iVar2);
  local_24 = 0;
  local_20 = 0;
  while( true ) {
    iVar2 = vec<Minisat::Watcher>::size(this_00);
    if (iVar2 <= local_20) break;
    vec<Minisat::Watcher>::operator[](this_00,local_20);
    bVar1 = WatcherDeleted::operator()(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if (!bVar1) {
      pWVar3 = vec<Minisat::Watcher>::operator[](this_00,local_20);
      pWVar4 = vec<Minisat::Watcher>::operator[](this_00,local_24);
      *pWVar4 = *pWVar3;
      local_24 = local_24 + 1;
    }
    local_20 = local_20 + 1;
  }
  vec<Minisat::Watcher>::shrink(this_00,local_20 - local_24);
  this_01 = in_RDI + 1;
  iVar2 = toInt((Lit)*in_RSI);
  pcVar5 = vec<char>::operator[]((vec<char> *)this_01,iVar2);
  *pcVar5 = '\0';
  return;
}

Assistant:

void OccLists<Idx, Vec, Deleted>::clean(const Idx &idx)
{
    Vec &vec = occs[toInt(idx)];
    int i, j;
    for (i = j = 0; i < vec.size(); i++)
        if (!deleted(vec[i])) vec[j++] = vec[i];
    vec.shrink(i - j);
    dirty[toInt(idx)] = 0;
}